

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImTriangulator::FlipNodeList(ImTriangulator *this)

{
  ImTriangulatorNode *pIVar1;
  ImTriangulatorNode *pIVar2;
  ImTriangulatorNode *pIVar3;
  ImTriangulatorNode *pIVar4;
  
  pIVar1 = this->_Nodes;
  pIVar3 = pIVar1;
  pIVar4 = pIVar1->Next;
  while( true ) {
    pIVar1->Next = pIVar3;
    pIVar3->Prev = pIVar1;
    if (pIVar4 == pIVar1) break;
    pIVar2 = pIVar4->Next;
    pIVar4->Next = pIVar3;
    pIVar3->Prev = pIVar4;
    pIVar3 = pIVar4;
    pIVar4 = pIVar2;
  }
  this->_Nodes = pIVar3;
  return;
}

Assistant:

void ImTriangulator::FlipNodeList()
{
    ImTriangulatorNode* prev = _Nodes;
    ImTriangulatorNode* temp = _Nodes;
    ImTriangulatorNode* current = _Nodes->Next;
    prev->Next = prev;
    prev->Prev = prev;
    while (current != _Nodes)
    {
        temp = current->Next;

        current->Next = prev;
        prev->Prev = current;
        _Nodes->Next = current;
        current->Prev = _Nodes;

        prev = current;
        current = temp;
    }
    _Nodes = prev;
}